

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

string * __thiscall HEkk::rebuildReason_abi_cxx11_(HEkk *this,HighsInt rebuild_reason)

{
  int in_EDX;
  string *in_RDI;
  string *rebuild_reason_string;
  
  std::__cxx11::string::string((string *)in_RDI);
  if (in_EDX == -1) {
    std::__cxx11::string::operator=((string *)in_RDI,"Perturbation cleanup");
  }
  else if (in_EDX == 0) {
    std::__cxx11::string::operator=((string *)in_RDI,"No reason");
  }
  else if (in_EDX == 1) {
    std::__cxx11::string::operator=((string *)in_RDI,"Update limit reached");
  }
  else if (in_EDX == 2) {
    std::__cxx11::string::operator=((string *)in_RDI,"Synthetic clock");
  }
  else if (in_EDX == 3) {
    std::__cxx11::string::operator=((string *)in_RDI,"Possibly optimal");
  }
  else if (in_EDX == 4) {
    std::__cxx11::string::operator=((string *)in_RDI,"Possibly phase 1 feasible");
  }
  else if (in_EDX == 5) {
    std::__cxx11::string::operator=((string *)in_RDI,"Possibly primal unbounded");
  }
  else if (in_EDX == 6) {
    std::__cxx11::string::operator=((string *)in_RDI,"Possibly dual unbounded");
  }
  else if (in_EDX == 7) {
    std::__cxx11::string::operator=((string *)in_RDI,"Possibly singular basis");
  }
  else if (in_EDX == 8) {
    std::__cxx11::string::operator=((string *)in_RDI,"Primal infeasible in primal simplex");
  }
  else if (in_EDX == 9) {
    std::__cxx11::string::operator=((string *)in_RDI,"Choose column failure");
  }
  else {
    std::__cxx11::string::operator=((string *)in_RDI,"Unidentified");
  }
  return in_RDI;
}

Assistant:

std::string HEkk::rebuildReason(const HighsInt rebuild_reason) {
  std::string rebuild_reason_string;
  if (rebuild_reason == kRebuildReasonCleanup) {
    rebuild_reason_string = "Perturbation cleanup";
  } else if (rebuild_reason == kRebuildReasonNo) {
    rebuild_reason_string = "No reason";
  } else if (rebuild_reason == kRebuildReasonUpdateLimitReached) {
    rebuild_reason_string = "Update limit reached";
  } else if (rebuild_reason == kRebuildReasonSyntheticClockSaysInvert) {
    rebuild_reason_string = "Synthetic clock";
  } else if (rebuild_reason == kRebuildReasonPossiblyOptimal) {
    rebuild_reason_string = "Possibly optimal";
  } else if (rebuild_reason == kRebuildReasonPossiblyPhase1Feasible) {
    rebuild_reason_string = "Possibly phase 1 feasible";
  } else if (rebuild_reason == kRebuildReasonPossiblyPrimalUnbounded) {
    rebuild_reason_string = "Possibly primal unbounded";
  } else if (rebuild_reason == kRebuildReasonPossiblyDualUnbounded) {
    rebuild_reason_string = "Possibly dual unbounded";
  } else if (rebuild_reason == kRebuildReasonPossiblySingularBasis) {
    rebuild_reason_string = "Possibly singular basis";
  } else if (rebuild_reason == kRebuildReasonPrimalInfeasibleInPrimalSimplex) {
    rebuild_reason_string = "Primal infeasible in primal simplex";
  } else if (rebuild_reason == kRebuildReasonChooseColumnFail) {
    rebuild_reason_string = "Choose column failure";
  } else {
    rebuild_reason_string = "Unidentified";
    assert(1 == 0);
  }
  return rebuild_reason_string;
}